

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt.cpp
# Opt level: O0

void get_msurf_descriptor_rounding_unconditional(integral_image *iimage,interest_point *ipoint)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  float *in_RSI;
  integral_image *in_RDI;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [64];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  int i_1;
  float norm_factor;
  float d4;
  float d3;
  float d2;
  float d1;
  float gauss_s2;
  float rry;
  float rrx;
  float ry;
  float rx;
  float gauss_s1;
  float gauss_s1_x;
  int k_1;
  int gauss_index_k;
  float gauss_s1_y;
  int l_1;
  int gauss_index_l_inc;
  int gauss_index_l;
  float mdy;
  float mdx;
  float dy;
  float dx;
  float *j_arr;
  int j;
  int gauss_index_k_inc;
  int gauss_index_k_start;
  float *i_arr;
  int i;
  float e_c1_p4;
  float e_c1_p3;
  float e_c1_p2;
  float e_c1_p1;
  float e_c1_m1;
  float e_c1_m2;
  float e_c1_m3;
  float e_c1_m4;
  float e_c0_p4;
  float e_c0_p3;
  float e_c0_p2;
  float e_c0_p1;
  float e_c0_m1;
  float e_c0_m2;
  float e_c0_m3;
  float e_c0_m4;
  float s11;
  float s10;
  float s9;
  float s8;
  float s7;
  float s6;
  float s5;
  float s4;
  float s3;
  float s2;
  float s1;
  float s0;
  int sample_x_sub_int_scale;
  int k_count;
  int k;
  int sample_y_sub_int_scale;
  int l_count;
  int l;
  int gauss_s2_index;
  float sum_of_squares;
  int desc_idx;
  float *descriptor;
  int height;
  int width;
  float ipoint_y_sub_int_scale_add_05;
  float ipoint_x_sub_int_scale_add_05;
  float ipoint_y_sub_int_scale;
  float ipoint_x_sub_int_scale;
  float ipoint_y;
  float ipoint_x;
  float g1_factor;
  float scale_squared;
  int int_scale;
  float scale;
  int local_15c;
  int local_128;
  int local_124;
  int local_11c;
  int local_114;
  float local_110;
  float local_10c;
  float local_108;
  float local_104;
  float *local_100;
  int local_f4;
  float *local_e8;
  int local_e0;
  int local_68;
  int local_64;
  int local_5c;
  int local_58;
  int local_54;
  float local_50;
  int local_4c;
  
  fVar30 = in_RSI[2];
  auVar24._8_4_ = 0x80000000;
  auVar24._0_8_ = 0x8000000080000000;
  auVar24._12_4_ = 0x80000000;
  auVar20._8_4_ = 0x3effffff;
  auVar20._0_8_ = 0x3effffff3effffff;
  auVar20._12_4_ = 0x3effffff;
  auVar17 = vpternlogd_avx512vl(auVar20,ZEXT416((uint)fVar30),auVar24,0xf8);
  auVar17 = vroundss_avx(ZEXT416((uint)fVar30),ZEXT416((uint)(fVar30 + auVar17._0_4_)),0xb);
  iVar14 = (int)auVar17._0_4_;
  fVar27 = -0.08 / (fVar30 * fVar30);
  fVar1 = *in_RSI;
  auVar25._8_4_ = 0x80000000;
  auVar25._0_8_ = 0x8000000080000000;
  auVar25._12_4_ = 0x80000000;
  auVar18._8_4_ = 0x3effffff;
  auVar18._0_8_ = 0x3effffff3effffff;
  auVar18._12_4_ = 0x3effffff;
  auVar17 = vpternlogd_avx512vl(auVar18,ZEXT416((uint)fVar1),auVar25,0xf8);
  auVar17 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)(fVar1 + auVar17._0_4_)),0xb);
  auVar22._0_8_ = (double)auVar17._0_4_;
  auVar22._8_8_ = 0;
  auVar17._0_8_ = (double)fVar30;
  auVar17._8_8_ = 0;
  auVar20 = vfmadd213sd_fma(ZEXT816(0x3fe0000000000000),auVar17,auVar22);
  fVar1 = in_RSI[1];
  auVar26._8_4_ = 0x80000000;
  auVar26._0_8_ = 0x8000000080000000;
  auVar26._12_4_ = 0x80000000;
  auVar19._8_4_ = 0x3effffff;
  auVar19._0_8_ = 0x3effffff3effffff;
  auVar19._12_4_ = 0x3effffff;
  auVar17 = vpternlogd_avx512vl(auVar19,ZEXT416((uint)fVar1),auVar26,0xf8);
  auVar17 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)(fVar1 + auVar17._0_4_)),0xb);
  auVar23._0_8_ = (double)auVar17._0_4_;
  auVar23._8_8_ = 0;
  auVar21._0_8_ = (double)fVar30;
  auVar21._8_8_ = 0;
  auVar17 = vfmadd213sd_fma(ZEXT816(0x3fe0000000000000),auVar21,auVar23);
  local_4c = 0;
  auVar43 = ZEXT1664((undefined1  [16])0x0);
  local_50 = 0.0;
  local_54 = 0;
  local_5c = 0;
  for (local_58 = -0xc; local_58 < 0xc; local_58 = local_58 + 1) {
    auVar44._0_4_ = (float)local_58;
    auVar44._4_12_ = auVar43._4_12_;
    auVar21 = vfmadd213ss_fma(ZEXT416((uint)fVar30),auVar44,
                              ZEXT416((uint)((float)auVar17._0_8_ - (float)iVar14)));
    auVar62._8_4_ = 0x80000000;
    auVar62._0_8_ = 0x8000000080000000;
    auVar62._12_4_ = 0x80000000;
    auVar45._8_4_ = 0x3effffff;
    auVar45._0_8_ = 0x3effffff3effffff;
    auVar45._12_4_ = 0x3effffff;
    auVar18 = vpternlogd_avx512vl(auVar45,auVar21,auVar62,0xf8);
    auVar21 = vroundss_avx(auVar21,ZEXT416((uint)(auVar21._0_4_ + auVar18._0_4_)),0xb);
    auVar43 = ZEXT1664(auVar21);
    local_68 = 0;
    for (local_64 = -0xc; local_64 < 0xc; local_64 = local_64 + 1) {
      auVar46._0_4_ = (float)local_64;
      auVar46._4_12_ = auVar43._4_12_;
      auVar18 = vfmadd213ss_fma(ZEXT416((uint)fVar30),auVar46,
                                ZEXT416((uint)((float)auVar20._0_8_ - (float)iVar14)));
      auVar63._8_4_ = 0x80000000;
      auVar63._0_8_ = 0x8000000080000000;
      auVar63._12_4_ = 0x80000000;
      auVar47._8_4_ = 0x3effffff;
      auVar47._0_8_ = 0x3effffff3effffff;
      auVar47._12_4_ = 0x3effffff;
      auVar19 = vpternlogd_avx512vl(auVar47,auVar18,auVar63,0xf8);
      auVar18 = vroundss_avx(auVar18,ZEXT416((uint)(auVar18._0_4_ + auVar19._0_4_)),0xb);
      auVar43 = ZEXT1664(auVar18);
      haarXY_unconditional
                (in_RDI,(int)auVar21._0_4_,(int)auVar18._0_4_,iVar14,
                 haarResponseX + (local_5c * 0x18 + local_68),
                 haarResponseY + (local_5c * 0x18 + local_68));
      local_68 = local_68 + 1;
    }
    local_5c = local_5c + 1;
  }
  auVar31._4_12_ = SUB1612(ZEXT816(0x3fe0000000000000),4);
  auVar31._0_4_ = fVar30 * 0.5;
  auVar64._8_4_ = 0x80000000;
  auVar64._0_8_ = 0x8000000080000000;
  auVar64._12_4_ = 0x80000000;
  auVar48._8_4_ = 0x3effffff;
  auVar48._0_8_ = 0x3effffff3effffff;
  auVar48._12_4_ = 0x3effffff;
  auVar17 = vpternlogd_avx512vl(auVar48,auVar31,auVar64,0xf8);
  auVar17 = vroundss_avx(auVar31,ZEXT416((uint)(fVar30 * 0.5 + auVar17._0_4_)),0xb);
  auVar32._4_12_ = SUB1612(ZEXT816(0x3ff8000000000000),4);
  auVar32._0_4_ = fVar30 * 1.5;
  auVar65._8_4_ = 0x80000000;
  auVar65._0_8_ = 0x8000000080000000;
  auVar65._12_4_ = 0x80000000;
  auVar49._8_4_ = 0x3effffff;
  auVar49._0_8_ = 0x3effffff3effffff;
  auVar49._12_4_ = 0x3effffff;
  auVar20 = vpternlogd_avx512vl(auVar49,auVar32,auVar65,0xf8);
  auVar20 = vroundss_avx(auVar32,ZEXT416((uint)(fVar30 * 1.5 + auVar20._0_4_)),0xb);
  auVar33._4_12_ = SUB1612(ZEXT816(0x4004000000000000),4);
  auVar33._0_4_ = fVar30 * 2.5;
  auVar66._8_4_ = 0x80000000;
  auVar66._0_8_ = 0x8000000080000000;
  auVar66._12_4_ = 0x80000000;
  auVar50._8_4_ = 0x3effffff;
  auVar50._0_8_ = 0x3effffff3effffff;
  auVar50._12_4_ = 0x3effffff;
  auVar21 = vpternlogd_avx512vl(auVar50,auVar33,auVar66,0xf8);
  auVar21 = vroundss_avx(auVar33,ZEXT416((uint)(fVar30 * 2.5 + auVar21._0_4_)),0xb);
  fVar28 = auVar21._0_4_;
  auVar34._4_12_ = SUB1612(ZEXT816(0x400c000000000000),4);
  auVar34._0_4_ = fVar30 * 3.5;
  auVar67._8_4_ = 0x80000000;
  auVar67._0_8_ = 0x8000000080000000;
  auVar67._12_4_ = 0x80000000;
  auVar51._8_4_ = 0x3effffff;
  auVar51._0_8_ = 0x3effffff3effffff;
  auVar51._12_4_ = 0x3effffff;
  auVar21 = vpternlogd_avx512vl(auVar51,auVar34,auVar67,0xf8);
  auVar21 = vroundss_avx(auVar34,ZEXT416((uint)(fVar30 * 3.5 + auVar21._0_4_)),0xb);
  auVar35._4_12_ = SUB1612(ZEXT816(0x4012000000000000),4);
  auVar35._0_4_ = fVar30 * 4.5;
  auVar68._8_4_ = 0x80000000;
  auVar68._0_8_ = 0x8000000080000000;
  auVar68._12_4_ = 0x80000000;
  auVar52._8_4_ = 0x3effffff;
  auVar52._0_8_ = 0x3effffff3effffff;
  auVar52._12_4_ = 0x3effffff;
  auVar18 = vpternlogd_avx512vl(auVar52,auVar35,auVar68,0xf8);
  auVar18 = vroundss_avx(auVar35,ZEXT416((uint)(fVar30 * 4.5 + auVar18._0_4_)),0xb);
  auVar36._4_12_ = SUB1612(ZEXT816(0x4016000000000000),4);
  auVar36._0_4_ = fVar30 * 5.5;
  auVar69._8_4_ = 0x80000000;
  auVar69._0_8_ = 0x8000000080000000;
  auVar69._12_4_ = 0x80000000;
  auVar53._8_4_ = 0x3effffff;
  auVar53._0_8_ = 0x3effffff3effffff;
  auVar53._12_4_ = 0x3effffff;
  auVar19 = vpternlogd_avx512vl(auVar53,auVar36,auVar69,0xf8);
  auVar19 = vroundss_avx(auVar36,ZEXT416((uint)(fVar30 * 5.5 + auVar19._0_4_)),0xb);
  auVar37._4_12_ = SUB1612(ZEXT816(0x401a000000000000),4);
  auVar37._0_4_ = fVar30 * 6.5;
  auVar70._8_4_ = 0x80000000;
  auVar70._0_8_ = 0x8000000080000000;
  auVar70._12_4_ = 0x80000000;
  auVar54._8_4_ = 0x3effffff;
  auVar54._0_8_ = 0x3effffff3effffff;
  auVar54._12_4_ = 0x3effffff;
  auVar22 = vpternlogd_avx512vl(auVar54,auVar37,auVar70,0xf8);
  auVar22 = vroundss_avx(auVar37,ZEXT416((uint)(fVar30 * 6.5 + auVar22._0_4_)),0xb);
  auVar38._4_12_ = SUB1612(ZEXT816(0x401e000000000000),4);
  auVar38._0_4_ = fVar30 * 7.5;
  auVar71._8_4_ = 0x80000000;
  auVar71._0_8_ = 0x8000000080000000;
  auVar71._12_4_ = 0x80000000;
  auVar55._8_4_ = 0x3effffff;
  auVar55._0_8_ = 0x3effffff3effffff;
  auVar55._12_4_ = 0x3effffff;
  auVar23 = vpternlogd_avx512vl(auVar55,auVar38,auVar71,0xf8);
  auVar23 = vroundss_avx(auVar38,ZEXT416((uint)(fVar30 * 7.5 + auVar23._0_4_)),0xb);
  fVar29 = auVar23._0_4_;
  auVar39._4_12_ = SUB1612(ZEXT816(0x4021000000000000),4);
  auVar39._0_4_ = fVar30 * 8.5;
  auVar72._8_4_ = 0x80000000;
  auVar72._0_8_ = 0x8000000080000000;
  auVar72._12_4_ = 0x80000000;
  auVar56._8_4_ = 0x3effffff;
  auVar56._0_8_ = 0x3effffff3effffff;
  auVar56._12_4_ = 0x3effffff;
  auVar23 = vpternlogd_avx512vl(auVar56,auVar39,auVar72,0xf8);
  auVar23 = vroundss_avx(auVar39,ZEXT416((uint)(fVar30 * 8.5 + auVar23._0_4_)),0xb);
  auVar40._4_12_ = SUB1612(ZEXT816(0x4023000000000000),4);
  auVar40._0_4_ = fVar30 * 9.5;
  auVar73._8_4_ = 0x80000000;
  auVar73._0_8_ = 0x8000000080000000;
  auVar73._12_4_ = 0x80000000;
  auVar57._8_4_ = 0x3effffff;
  auVar57._0_8_ = 0x3effffff3effffff;
  auVar57._12_4_ = 0x3effffff;
  auVar24 = vpternlogd_avx512vl(auVar57,auVar40,auVar73,0xf8);
  auVar24 = vroundss_avx(auVar40,ZEXT416((uint)(fVar30 * 9.5 + auVar24._0_4_)),0xb);
  auVar41._4_12_ = SUB1612(ZEXT816(0x4025000000000000),4);
  auVar41._0_4_ = fVar30 * 10.5;
  auVar74._8_4_ = 0x80000000;
  auVar74._0_8_ = 0x8000000080000000;
  auVar74._12_4_ = 0x80000000;
  auVar58._8_4_ = 0x3effffff;
  auVar58._0_8_ = 0x3effffff3effffff;
  auVar58._12_4_ = 0x3effffff;
  auVar25 = vpternlogd_avx512vl(auVar58,auVar41,auVar74,0xf8);
  auVar25 = vroundss_avx(auVar41,ZEXT416((uint)(fVar30 * 10.5 + auVar25._0_4_)),0xb);
  auVar42._4_12_ = SUB1612(ZEXT816(0x4027000000000000),4);
  auVar42._0_4_ = fVar30 * 11.5;
  auVar75._8_4_ = 0x80000000;
  auVar75._0_8_ = 0x8000000080000000;
  auVar75._12_4_ = 0x80000000;
  auVar59._8_4_ = 0x3effffff;
  auVar59._0_8_ = 0x3effffff3effffff;
  auVar59._12_4_ = 0x3effffff;
  auVar26 = vpternlogd_avx512vl(auVar59,auVar42,auVar75,0xf8);
  auVar26 = vroundss_avx(auVar42,ZEXT416((uint)(fVar30 * 11.5 + auVar26._0_4_)),0xb);
  fVar30 = fVar28 + auVar20._0_4_;
  fVar1 = fVar28 + auVar17._0_4_;
  fVar2 = fVar28 - auVar17._0_4_;
  fVar3 = fVar28 - auVar20._0_4_;
  fVar4 = fVar28 - auVar21._0_4_;
  fVar5 = fVar28 - auVar18._0_4_;
  fVar6 = fVar28 - auVar19._0_4_;
  fVar28 = fVar28 - auVar22._0_4_;
  fVar7 = fVar29 - auVar21._0_4_;
  fVar8 = fVar29 - auVar18._0_4_;
  fVar9 = fVar29 - auVar19._0_4_;
  fVar10 = fVar29 - auVar22._0_4_;
  fVar11 = fVar29 - auVar23._0_4_;
  fVar12 = fVar29 - auVar24._0_4_;
  fVar13 = fVar29 - auVar25._0_4_;
  fVar29 = fVar29 - auVar26._0_4_;
  gauss_s1_c0[0] = expf(fVar27 * fVar30 * fVar30);
  gauss_s1_c0[1] = expf(fVar27 * fVar1 * fVar1);
  gauss_s1_c0[2] = expf(fVar27 * fVar2 * fVar2);
  gauss_s1_c0[3] = expf(fVar27 * fVar3 * fVar3);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar27 * fVar4 * fVar4);
  gauss_s1_c0[6] = expf(fVar27 * fVar5 * fVar5);
  gauss_s1_c0[7] = expf(fVar27 * fVar6 * fVar6);
  gauss_s1_c0[8] = expf(fVar27 * fVar28 * fVar28);
  gauss_s1_c1[0] = expf(fVar27 * fVar7 * fVar7);
  gauss_s1_c1[1] = expf(fVar27 * fVar8 * fVar8);
  gauss_s1_c1[2] = expf(fVar27 * fVar9 * fVar9);
  gauss_s1_c1[3] = expf(fVar27 * fVar10 * fVar10);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar27 * fVar11 * fVar11);
  gauss_s1_c1[6] = expf(fVar27 * fVar12 * fVar12);
  gauss_s1_c1[7] = expf(fVar27 * fVar13 * fVar13);
  gauss_s1_c1[8] = expf(fVar27 * fVar29 * fVar29);
  for (local_e0 = -8; local_e0 < 8; local_e0 = local_e0 + 5) {
    if ((local_e0 == -8) || (local_e0 == 7)) {
      local_e8 = gauss_s1_c1;
    }
    else {
      local_e8 = gauss_s1_c0;
    }
    iVar14 = 0;
    if (local_e0 < 0) {
      iVar14 = 8;
    }
    iVar15 = 1;
    if (local_e0 < 0) {
      iVar15 = -1;
    }
    for (local_f4 = -8; local_f4 < 8; local_f4 = local_f4 + 5) {
      if ((local_f4 == -8) || (local_f4 == 7)) {
        local_100 = gauss_s1_c1;
      }
      else {
        local_100 = gauss_s1_c0;
      }
      local_104 = 0.0;
      local_108 = 0.0;
      local_10c = 0.0;
      local_110 = 0.0;
      local_114 = 0;
      if (local_f4 < 0) {
        local_114 = 8;
      }
      iVar16 = 1;
      if (local_f4 < 0) {
        iVar16 = -1;
      }
      for (local_11c = (local_f4 + 8) * 0x18;
          SBORROW4(local_11c,(local_f4 + 0x11) * 0x18) != local_11c + (local_f4 + 0x11) * -0x18 < 0;
          local_11c = local_11c + 0x18) {
        local_124 = iVar14;
        for (local_128 = local_e0 + 8; local_128 < local_e0 + 0x11; local_128 = local_128 + 1) {
          fVar30 = local_e8[local_124] * local_100[local_114] * haarResponseY[local_11c + local_128]
          ;
          fVar1 = local_e8[local_124] * local_100[local_114] * haarResponseX[local_11c + local_128];
          local_104 = fVar30 + local_104;
          local_108 = fVar1 + local_108;
          auVar60._8_4_ = 0x7fffffff;
          auVar60._0_8_ = 0x7fffffff7fffffff;
          auVar60._12_4_ = 0x7fffffff;
          auVar17 = vpand_avx(ZEXT416((uint)fVar30),auVar60);
          local_10c = auVar17._0_4_ + local_10c;
          auVar61._8_4_ = 0x7fffffff;
          auVar61._0_8_ = 0x7fffffff7fffffff;
          auVar61._12_4_ = 0x7fffffff;
          auVar17 = vpand_avx(ZEXT416((uint)fVar1),auVar61);
          local_110 = auVar17._0_4_ + local_110;
          local_124 = iVar15 + local_124;
        }
        local_114 = iVar16 + local_114;
      }
      fVar30 = gauss_s2_arr[local_54];
      local_54 = local_54 + 1;
      local_104 = local_104 * fVar30;
      local_108 = local_108 * fVar30;
      local_10c = local_10c * fVar30;
      local_110 = local_110 * fVar30;
      in_RSI[(long)local_4c + 5] = local_104;
      in_RSI[(long)(local_4c + 1) + 5] = local_108;
      in_RSI[(long)(local_4c + 2) + 5] = local_10c;
      in_RSI[(long)(local_4c + 3) + 5] = local_110;
      auVar17 = vfmadd213ss_fma(ZEXT416((uint)local_104),ZEXT416((uint)local_104),
                                ZEXT416((uint)(local_108 * local_108)));
      auVar17 = vfmadd213ss_fma(ZEXT416((uint)local_10c),ZEXT416((uint)local_10c),auVar17);
      auVar17 = vfmadd213ss_fma(ZEXT416((uint)local_110),ZEXT416((uint)local_110),auVar17);
      local_50 = auVar17._0_4_ + local_50;
      local_4c = local_4c + 4;
    }
  }
  fVar30 = sqrtf(local_50);
  for (local_15c = 0; local_15c < 0x40; local_15c = local_15c + 1) {
    in_RSI[(long)local_15c + 5] = (1.0 / fVar30) * in_RSI[(long)local_15c + 5];
  }
  return;
}

Assistant:

void get_msurf_descriptor_rounding_unconditional(struct integral_image* iimage, struct interest_point* ipoint) {
    /*
    applied optimizations:
        - all of get_msurf_descriptor_gauss_pecompute_haar_rounding
        - replaced case statements with static arrays
    */

    float scale = ipoint->scale;
    // float scale_mul_25f = 2.5f*scale;
    int int_scale = (int) roundf(scale);
    // int int_scale_mul_2 =  2 * int_scale;
    float scale_squared = scale*scale;

    float g1_factor = -0.08f / (scale_squared); // since 0.08f / (scale*scale) == 1.0f / (2.0f * 2.5f * scale * 2.5f * scale)
    //float g2_factor = -1.0f / 4.5f; // since 1.0f / 4.5f == 1.0f / (2.0f * 1.5f * 1.5f)

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary

    for (int l=-12, l_count=0; l<12; ++l, ++l_count) {
        // int sample_y = (int) roundf(ipoint_y + l * scale);
        int sample_y_sub_int_scale = (int) roundf(ipoint_y_sub_int_scale + l * scale);// + (ipoint_y_sub_int_scale_add_l_mul_scale>=0 ? 0.5 : -0.5));

        for (int k=-12, k_count=0; k<12; ++k, k_count++) {
            int sample_x_sub_int_scale = (int) roundf(ipoint_x_sub_int_scale + k * scale);// + (ipoint_x_sub_int_scale_add_k_mul_scale>=0 ? 0.5 : -0.5));

            haarXY_unconditional(iimage, sample_y_sub_int_scale, sample_x_sub_int_scale, int_scale, &haarResponseX[l_count*24+k_count], &haarResponseY[l_count*24+k_count]);

        }

    }
        

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}